

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_cbor_tests.cpp
# Opt level: O3

void check_encode_cbor(vector<unsigned_char,_std::allocator<unsigned_char>_> *expected,json *j)

{
  uchar uVar1;
  uchar uVar2;
  pointer puVar3;
  pointer puVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  AssertionHandler catchAssertionHandler;
  SourceLineInfo local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  ITransientExpression local_e0;
  long *local_d0;
  char *local_c8;
  size_t sStack_c0;
  long *local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_b0;
  StringRef local_a8;
  AssertionHandler local_98;
  long local_50;
  long local_48;
  StringRef local_40;
  
  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.m_assertionInfo.lineInfo.line._0_4_ = 0x400;
  local_98.m_assertionInfo.macroName.m_start = jsoncons::cbor::cbor_encode_options::vtable + 0x18;
  local_98.m_assertionInfo.lineInfo.file = jsoncons::cbor::cbor_encode_options::vtable + 0x40;
  local_98.m_assertionInfo.macroName.m_size._0_2_ = 0;
  jsoncons::cbor::
  encode_cbor<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (j,&local_f8,(cbor_encode_options *)&local_98);
  if ((long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start !=
      (long)(expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start) {
    pbVar5 = jsoncons::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,j);
    std::__ostream_insert<char,std::char_traits<char>>(pbVar5,"\n",1);
  }
  local_e0._vptr_ITransientExpression = (_func_int **)0x7fc916;
  local_e0.m_isBinaryExpression = true;
  local_e0.m_result = false;
  local_e0._10_6_ = 0;
  local_108.file =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/cbor/src/encode_cbor_tests.cpp"
  ;
  local_108.line = 0x1b;
  Catch::StringRef::StringRef(&local_40,"result.size() == expected.size()");
  Catch::AssertionHandler::AssertionHandler
            (&local_98,(StringRef *)&local_e0,&local_108,local_40,Normal);
  lVar7 = (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = (long)(expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_start;
  local_50 = lVar6;
  local_48 = lVar7;
  Catch::StringRef::StringRef((StringRef *)&local_108,"==");
  local_e0.m_result = lVar7 == lVar6;
  local_e0.m_isBinaryExpression = true;
  local_e0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b30bd8;
  local_c8 = local_108.file;
  sStack_c0 = local_108.line;
  local_d0 = &local_48;
  local_b8 = &local_50;
  Catch::AssertionHandler::handleExpr(&local_98,&local_e0);
  Catch::ITransientExpression::~ITransientExpression(&local_e0);
  Catch::AssertionHandler::complete(&local_98);
  if (local_98.m_completed == false) {
    (*(local_98.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  if ((expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar8 = 0;
    local_b0 = expected;
    do {
      local_e0._vptr_ITransientExpression = (_func_int **)0x7fc916;
      local_e0.m_isBinaryExpression = true;
      local_e0.m_result = false;
      local_e0._10_6_ = 0;
      local_108.file =
           "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/cbor/src/encode_cbor_tests.cpp"
      ;
      local_108.line = 0x1e;
      Catch::StringRef::StringRef(&local_a8,"result[i] == expected[i]");
      Catch::AssertionHandler::AssertionHandler
                (&local_98,(StringRef *)&local_e0,&local_108,local_a8,Normal);
      puVar4 = local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_start;
      uVar1 = local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8];
      uVar2 = puVar3[uVar8];
      Catch::StringRef::StringRef((StringRef *)&local_108,"==");
      local_e0.m_result = uVar1 == uVar2;
      local_e0.m_isBinaryExpression = true;
      local_d0 = (long *)(puVar4 + uVar8);
      local_b8 = (long *)(puVar3 + uVar8);
      local_e0._vptr_ITransientExpression =
           (_func_int **)&PTR_streamReconstructedExpression_00b30c18;
      local_c8 = local_108.file;
      sStack_c0 = local_108.line;
      Catch::AssertionHandler::handleExpr(&local_98,&local_e0);
      Catch::ITransientExpression::~ITransientExpression(&local_e0);
      Catch::AssertionHandler::complete(&local_98);
      expected = local_b0;
      if (local_98.m_completed == false) {
        (*(local_98.m_resultCapture)->_vptr_IResultCapture[0xe])(local_98.m_resultCapture,&local_98)
        ;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)(expected->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(expected->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_start));
  }
  if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void check_encode_cbor(const std::vector<uint8_t>& expected, const json& j)
{
    std::vector<uint8_t> result;
    cbor::encode_cbor(j,result);

    if (result.size() != expected.size())
    {
        std::cout << j << "\n";
    }
    REQUIRE(result.size() == expected.size());
    for (std::size_t i = 0; i < expected.size(); ++i)
    {
        REQUIRE(result[i] == expected[i]);
    }
}